

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewScObjectCommon
              (RecyclableObject *function,FunctionInfo *functionInfo,ScriptContext *requestContext,
              bool isBaseClassConstructorNewScObject)

{
  code *pcVar1;
  bool bVar2;
  Attributes AVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  int iVar6;
  ScriptContext *pSVar7;
  ScriptContext *pSVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  RecyclableObject *pRVar11;
  Recycler *recycler;
  ThreadContext *this;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  undefined4 extraout_var;
  Var aValue;
  JavascriptLibrary *this_02;
  DynamicTypeHandler *pDVar12;
  DynamicType *pDVar13;
  DynamicType *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16_t *local_280;
  char16_t *local_278;
  char16_t *local_268;
  char16_t *local_250;
  char16_t *local_240;
  char16_t *local_228;
  char16_t *local_1f8;
  char16_t *local_1e0;
  FunctionBody *local_1d0;
  wchar local_1b8 [4];
  char16 debugStringBuffer_2 [42];
  char16 *ctorName_2;
  char16 debugStringBuffer_1 [42];
  char16 *ctorName_1;
  DynamicType *newObjectType;
  DynamicObject *newObject;
  RecyclableObject *prototype;
  wchar local_d8 [3];
  bool prototypeCanBeCached;
  char16 debugStringBuffer [42];
  char16 *ctorName;
  FunctionBody *functionBody;
  FunctionProxy *ctorProxy;
  Attributes attributes;
  ScriptContext *constructorScriptContext;
  Var object;
  DynamicType *pDStack_48;
  bool cachedProtoCanBeCached;
  DynamicType *type;
  ConstructorCache *constructorCache;
  JavascriptFunction *constructor;
  ScriptContext *pSStack_28;
  bool isBaseClassConstructorNewScObject_local;
  ScriptContext *requestContext_local;
  FunctionInfo *functionInfo_local;
  RecyclableObject *function_local;
  
  constructor._7_1_ = isBaseClassConstructorNewScObject;
  pSStack_28 = requestContext;
  requestContext_local = (ScriptContext *)functionInfo;
  functionInfo_local = (FunctionInfo *)function;
  constructorCache =
       (ConstructorCache *)UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
  bVar2 = FunctionInfo::IsClassConstructor((FunctionInfo *)requestContext_local);
  if ((bVar2) && ((constructor._7_1_ & 1) == 0)) {
    return (RecyclableObject *)functionInfo_local;
  }
  type = (DynamicType *)
         JavascriptFunction::GetConstructorCache((JavascriptFunction *)constructorCache);
  pSVar7 = ConstructorCache::GetScriptContext((ConstructorCache *)type);
  if (pSVar7 != (ScriptContext *)0x0) {
    pSVar7 = ConstructorCache::GetScriptContext((ConstructorCache *)type);
    pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)constructorCache);
    if (pSVar7 != pSVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x196e,
                                  "(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext())"
                                  ,
                                  "Why did we populate a constructor cache with a mismatched script context?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  if (type == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1970,"(constructorCache != nullptr)",
                                "constructorCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pDStack_48 = ConstructorCache::GetGuardValueAsType((ConstructorCache *)type);
  if ((pDStack_48 != (DynamicType *)0x0) &&
     (pSVar7 = ConstructorCache::GetScriptContext((ConstructorCache *)type), pSVar7 == pSStack_28))
  {
    pRVar10 = Js::Type::GetPrototype(&pDStack_48->super_Type);
    pRVar11 = GetPrototypeObjectForConstructorCache
                        ((RecyclableObject *)constructorCache,pSStack_28,(bool *)((long)&object + 7)
                        );
    if (pRVar10 != pRVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1976,
                                  "(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached))"
                                  ,
                                  "type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((object._7_1_ & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1977,"(cachedProtoCanBeCached)","cachedProtoCanBeCached");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar2 = DynamicType::GetIsShared(pDStack_48);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1978,"(type->GetIsShared())","type->GetIsShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    TraceUseConstructorCache((ConstructorCache *)type,(JavascriptFunction *)constructorCache,true);
    recycler = ScriptContext::GetRecycler(pSStack_28);
    constructorScriptContext = (ScriptContext *)DynamicObject::New(recycler,pDStack_48);
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar2) {
      pRVar10 = Js::JavascriptProxy::AutoProxyWrapper(constructorScriptContext);
      constructorScriptContext =
           (ScriptContext *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar10);
    }
    return (RecyclableObject *)constructorScriptContext;
  }
  bVar2 = ConstructorCache::SkipDefaultNewObject((ConstructorCache *)type);
  if (bVar2) {
    bVar2 = ConstructorCache::NeedsUpdateAfterCtor((ConstructorCache *)type);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x198b,"(!constructorCache->NeedsUpdateAfterCtor())",
                                  "!constructorCache->NeedsUpdateAfterCtor()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    TraceUseConstructorCache((ConstructorCache *)type,(JavascriptFunction *)constructorCache,true);
    if ((constructor._7_1_ & 1) == 0) {
      return (RecyclableObject *)0x0;
    }
    pRVar10 = CreateFromConstructor((RecyclableObject *)functionInfo_local,pSStack_28);
    return pRVar10;
  }
  TraceUseConstructorCache((ConstructorCache *)type,(JavascriptFunction *)constructorCache,false);
  pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)functionInfo_local);
  this = ScriptContext::GetThreadContext(pSVar7);
  bVar2 = ThreadContext::IsDisableImplicitException(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x199d,
                                "(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException())"
                                ,
                                "!constructorScriptContext->GetThreadContext()->IsDisableImplicitException()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  ScriptContext::VerifyAlive(pSVar7,1,pSStack_28);
  AVar3 = FunctionInfo::GetAttributes((FunctionInfo *)requestContext_local);
  if ((AVar3 & ErrorOnNew) != None) {
    JavascriptError::ThrowTypeError(pSStack_28,-0x7ff5ebf5,(PCWSTR)0x0);
  }
  this_00 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)constructorCache);
  if (this_00 == (FunctionProxy *)0x0) {
    local_1d0 = (FunctionBody *)0x0;
  }
  else {
    this_01 = FunctionProxy::EnsureDeserialized(this_00);
    local_1d0 = ParseableFunctionInfo::Parse(this_01,(ScriptFunction **)0x0,false);
  }
  if ((AVar3 & SkipDefaultNewObject) == None) {
    pRVar10 = GetPrototypeObjectForConstructorCache
                        ((RecyclableObject *)functionInfo_local,pSVar7,
                         (bool *)((long)&prototype + 7));
    aValue = CrossSite::MarshalVar(pSStack_28,pRVar10,pSVar7);
    pRVar10 = VarTo<Js::RecyclableObject>(aValue);
    this_02 = ScriptContext::GetLibrary(pSStack_28);
    newObjectType = (DynamicType *)JavascriptLibrary::CreateObject(this_02,pRVar10,8);
    bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar2) {
      pRVar11 = Js::JavascriptProxy::AutoProxyWrapper(newObjectType);
      newObjectType = (DynamicType *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar11);
    }
    pDVar12 = DynamicObject::GetTypeHandler((DynamicObject *)newObjectType);
    iVar6 = (*pDVar12->_vptr_DynamicTypeHandler[6])();
    if (iVar6 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x19dc,"(newObject->GetTypeHandler()->GetPropertyCount() == 0)",
                                  "newObject->GetTypeHandler()->GetPropertyCount() == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if (((((prototype._7_1_ & 1) != 0) && (local_1d0 != (FunctionBody *)0x0)) &&
        (pSStack_28 == pSVar7)) &&
       ((bVar2 = VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)newObjectType),
        !bVar2 && (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstructorCachePhase), !bVar2)
        ))) {
      uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_1d0);
      LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_1d0);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstructorCachePhase,uVar4,LVar5);
      if (!bVar2) {
        pDVar13 = DynamicObject::GetDynamicType((DynamicObject *)newObjectType);
        bVar2 = DynamicType::GetIsShared(pDVar13);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x19e4,"(newObjectType->GetIsShared())",
                                      "newObjectType->GetIsShared()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        this_03 = (DynamicType *)
                  JavascriptFunction::EnsureValidConstructorCache
                            ((JavascriptFunction *)constructorCache);
        type = this_03;
        bVar2 = ParseableFunctionInfo::GetHasNoExplicitReturnValue
                          (&local_1d0->super_ParseableFunctionInfo);
        ConstructorCache::Populate((ConstructorCache *)this_03,pDVar13,pSVar7,bVar2,true);
        bVar2 = ConstructorCache::IsConsistent((ConstructorCache *)type);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x19ed,"(constructorCache->IsConsistent())",
                                      "constructorCache->IsConsistent()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        if (local_1d0 != (FunctionBody *)0x0) {
          uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_1d0);
          LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_1d0);
          bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase,uVar4,LVar5);
          if (bVar2) goto LAB_00fa11ad;
        }
        if (local_1d0 != (FunctionBody *)0x0) {
          return newObjectType;
        }
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase);
        if (!bVar2) {
          return newObjectType;
        }
LAB_00fa11ad:
        if (local_1d0 == (FunctionBody *)0x0) {
          local_228 = L"<unknown>";
        }
        else {
          iVar6 = (*(local_1d0->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          local_228 = (char16_t *)CONCAT44(extraout_var_00,iVar6);
        }
        pDVar13 = type;
        stack0xffffffffffffff00 = local_228;
        if (local_1d0 == (FunctionBody *)0x0) {
          local_240 = L"(null)";
        }
        else {
          local_240 = FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)local_1d0,(wchar (*) [42])&ctorName_2);
        }
        Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pDVar13,local_228,
                      local_240);
        ConstructorCache::Dump((ConstructorCache *)type);
        Output::Print(L"\n");
        Output::Flush();
        return newObjectType;
      }
    }
    if (local_1d0 != (FunctionBody *)0x0) {
      uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_1d0);
      LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_1d0);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase,uVar4,LVar5);
      if (bVar2) goto LAB_00fa12e1;
    }
    if (local_1d0 != (FunctionBody *)0x0) {
      return newObjectType;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase);
    if (!bVar2) {
      return newObjectType;
    }
LAB_00fa12e1:
    if (local_1d0 == (FunctionBody *)0x0) {
      local_250 = L"<unknown>";
    }
    else {
      iVar6 = (*(local_1d0->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      local_250 = (char16_t *)CONCAT44(extraout_var_01,iVar6);
    }
    pDVar13 = type;
    stack0xfffffffffffffea0 = local_250;
    if (local_1d0 == (FunctionBody *)0x0) {
      local_268 = L"(null)";
    }
    else {
      local_268 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)local_1d0,(wchar (*) [42])local_1b8);
    }
    if ((prototype._7_1_ & 1) == 0) {
      local_278 = L"prototype cannot be cached";
    }
    else {
      if (local_1d0 == (FunctionBody *)0x0) {
        local_280 = L"function has no body";
      }
      else {
        local_280 = L"constructor cache phase is off";
        if (pSStack_28 != pSVar7) {
          local_280 = L"of cross-context call";
        }
      }
      local_278 = local_280;
    }
    Output::Print(L"CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"
                  ,pDVar13,local_250,local_268,local_278,pRVar10,local_1d0,pSVar7,pSStack_28);
    Output::Print(L"\n");
    Output::Flush();
    return (RecyclableObject *)newObjectType;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstructorCachePhase);
  if (bVar2) goto LAB_00fa0d92;
  if (local_1d0 != (FunctionBody *)0x0) {
    uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_1d0);
    LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_1d0);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ConstructorCachePhase,uVar4,LVar5);
    if (bVar2) goto LAB_00fa0d92;
  }
  type = (DynamicType *)
         JavascriptFunction::EnsureValidConstructorCache((JavascriptFunction *)constructorCache);
  ConstructorCache::PopulateForSkipDefaultNewObject((ConstructorCache *)type,pSVar7);
  if (local_1d0 == (FunctionBody *)0x0) {
LAB_00fa0caa:
    if ((local_1d0 != (FunctionBody *)0x0) ||
       (bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase), !bVar2))
    goto LAB_00fa0d92;
  }
  else {
    uVar4 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_1d0);
    LVar5 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_1d0);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase,uVar4,LVar5);
    if (!bVar2) goto LAB_00fa0caa;
  }
  if (local_1d0 == (FunctionBody *)0x0) {
    local_1e0 = L"<unknown>";
  }
  else {
    iVar6 = (*(local_1d0->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    local_1e0 = (char16_t *)CONCAT44(extraout_var,iVar6);
  }
  pDVar13 = type;
  stack0xffffffffffffff80 = local_1e0;
  if (local_1d0 == (FunctionBody *)0x0) {
    local_1f8 = L"(null)";
  }
  else {
    local_1f8 = FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)local_1d0,(wchar (*) [42])local_d8);
  }
  Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pDVar13,local_1e0,local_1f8)
  ;
  ConstructorCache::Dump((ConstructorCache *)type);
  Output::Print(L"\n");
  Output::Flush();
LAB_00fa0d92:
  bVar2 = ConstructorCache::NeedsUpdateAfterCtor((ConstructorCache *)type);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x19c4,"(!constructorCache->NeedsUpdateAfterCtor())",
                                "!constructorCache->NeedsUpdateAfterCtor()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  return (RecyclableObject *)0x0;
}

Assistant:

Var JavascriptOperators::NewScObjectCommon(RecyclableObject * function, FunctionInfo* functionInfo, ScriptContext * requestContext, bool isBaseClassConstructorNewScObject)
    {
        // CONSIDER: Allow for the cache to be repopulated if the type got collected, and a new one got populated with
        // the same number of inlined slots. This requires that the JIT-ed code actually load the type from the cache
        // (instead of hard-coding it), but it can (and must) keep the hard-coded number of inline slots.
        // CONSIDER: Consider also not pinning the type in the cache.  This can be done by using a registration based
        // weak reference (we need to control the memory address), which we don't yet have, or by allocating the cache from
        // the inline cache arena to allow it to be zeroed, but retain a recycler-allocated portion to hold on to the size of
        // inlined slots.

        JavascriptFunction* constructor = UnsafeVarTo<JavascriptFunction>(function);
        if (functionInfo->IsClassConstructor() && !isBaseClassConstructorNewScObject)
        {
            // If we are calling new on a class constructor, the contract is that we pass new.target as the 'this' argument.
            // function is the constructor on which we called new - which is new.target.
            // If we are trying to construct the object for a base class constructor as part of a super call, we should not
            // store new.target in the 'this' argument.
            return function;
        }
        ConstructorCache* constructorCache = constructor->GetConstructorCache();
        AssertMsg(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext(),
            "Why did we populate a constructor cache with a mismatched script context?");

        Assert(constructorCache != nullptr);
        DynamicType* type = constructorCache->GetGuardValueAsType();
        if (type != nullptr && constructorCache->GetScriptContext() == requestContext)
        {
#if DBG
            bool cachedProtoCanBeCached;
            Assert(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached));
            Assert(cachedProtoCanBeCached);
            Assert(type->GetIsShared());
#endif

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            Var object = DynamicObject::New(requestContext->GetRecycler(), type);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
            }
#endif
            return object;
        }

        if (constructorCache->SkipDefaultNewObject())
        {
            Assert(!constructorCache->NeedsUpdateAfterCtor());

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            if (isBaseClassConstructorNewScObject)
            {
                return JavascriptOperators::CreateFromConstructor(function, requestContext);
            }

            return nullptr;
        }

#if DBG_DUMP
        TraceUseConstructorCache(constructorCache, constructor, false);
#endif

        ScriptContext* constructorScriptContext = function->GetScriptContext();
        Assert(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException());
        // we shouldn't try to call the constructor if it's closed already.
        constructorScriptContext->VerifyAlive(TRUE, requestContext);

        FunctionInfo::Attributes attributes = functionInfo->GetAttributes();
        if (attributes & FunctionInfo::ErrorOnNew)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnNew);
        }

        // Slow path
        FunctionProxy * ctorProxy = constructor->GetFunctionProxy();
        FunctionBody * functionBody = ctorProxy != nullptr ? ctorProxy->EnsureDeserialized()->Parse() : nullptr;

        if (attributes & FunctionInfo::SkipDefaultNewObject)
        {
            // The constructor doesn't use the default new object.
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            if (!PHASE_OFF1(ConstructorCachePhase) && (functionBody == nullptr || !PHASE_OFF(ConstructorCachePhase, functionBody)))
            {
                constructorCache = constructor->EnsureValidConstructorCache();
                constructorCache->PopulateForSkipDefaultNewObject(constructorScriptContext);

#if DBG_DUMP
                if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
                {
                    const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                        functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                    constructorCache->Dump();
                    Output::Print(_u("\n"));
                    Output::Flush();
                }
#endif

            }

            Assert(!constructorCache->NeedsUpdateAfterCtor());
            return nullptr;
        }

        // CONSIDER: Create some form of PatchGetProtoObjForCtorCache, which actually caches the prototype object in the constructor cache.
        // Make sure that it does NOT populate the guard field.  On the slow path (the only path for cross-context calls) we can do a faster lookup
        // after we fail the guard check.  When invalidating the cache for proto change, make sure we zap the prototype field of the cache in
        // addition to the guard value.
        bool prototypeCanBeCached;
        RecyclableObject* prototype = JavascriptOperators::GetPrototypeObjectForConstructorCache(
          function, constructorScriptContext, prototypeCanBeCached);
        prototype = VarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext,
          prototype, constructorScriptContext));

        DynamicObject* newObject = requestContext->GetLibrary()->CreateObject(prototype, 8);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
        }
#endif

        Assert(newObject->GetTypeHandler()->GetPropertyCount() == 0);

        if (prototypeCanBeCached && functionBody != nullptr && requestContext == constructorScriptContext &&
            !Js::VarIs<Js::JavascriptProxy>(newObject) &&
            !PHASE_OFF1(ConstructorCachePhase) && !PHASE_OFF(ConstructorCachePhase, functionBody))
        {
            DynamicType* newObjectType = newObject->GetDynamicType();
            // Initial type (without any properties) should always be shared up-front.  This allows us to populate the cache right away.
            Assert(newObjectType->GetIsShared());

            // Populate the cache here and set the updateAfterCtor flag.  This way, if the ctor is called recursively the
            // recursive calls will hit the cache and use the initial type.  On the unwind path, we will update the cache
            // after the innermost ctor and clear the flag.  After subsequent ctors we won't attempt an update anymore.
            // As long as the updateAfterCtor flag is set it is safe to update the cache, because it would not have been
            // hard-coded in the JIT-ed code.
            constructorCache = constructor->EnsureValidConstructorCache();
            constructorCache->Populate(newObjectType, constructorScriptContext, functionBody->GetHasNoExplicitReturnValue(), true);
            Assert(constructorCache->IsConsistent());

#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                    functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                constructorCache->Dump();
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }
        else
        {
#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"),
                    constructorCache, ctorName, functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                    !prototypeCanBeCached ? _u("prototype cannot be cached") :
                    functionBody == nullptr ? _u("function has no body") :
                    requestContext != constructorScriptContext ? _u("of cross-context call") : _u("constructor cache phase is off"),
                    prototype, functionBody, constructorScriptContext, requestContext);
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }

        return newObject;
    }